

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_pkt.cc
# Opt level: O0

int bssl::ssl_send_alert_impl(SSL *ssl,int level,int desc)

{
  bool bVar1;
  int desc_local;
  int level_local;
  SSL *ssl_local;
  
  if (ssl->s3->write_shutdown == ssl_shutdown_none) {
    if ((level == 1) && (desc == 0)) {
      ssl->s3->write_shutdown = ssl_shutdown_close_notify;
    }
    else {
      if (level != 2) {
        __assert_fail("level == SSL3_AL_FATAL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_pkt.cc"
                      ,0x159,"int bssl::ssl_send_alert_impl(SSL *, int, int)");
      }
      if (desc == 0) {
        __assert_fail("desc != SSL_AD_CLOSE_NOTIFY",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_pkt.cc"
                      ,0x15a,"int bssl::ssl_send_alert_impl(SSL *, int, int)");
      }
      ssl->s3->write_shutdown = ssl_shutdown_error;
    }
    *(ushort *)&ssl->s3->field_0xdc = *(ushort *)&ssl->s3->field_0xdc & 0xfbff | 0x400;
    ssl->s3->send_alert[0] = (uint8_t)level;
    ssl->s3->send_alert[1] = (uint8_t)desc;
    bVar1 = SSLBuffer::empty(&ssl->s3->write_buffer);
    if (bVar1) {
      ssl_local._4_4_ = (*ssl->method->dispatch_alert)(ssl);
    }
    else {
      ssl_local._4_4_ = -1;
    }
  }
  else {
    ERR_put_error(0x10,0,0xc2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_pkt.cc"
                  ,0x152);
    ssl_local._4_4_ = -1;
  }
  return ssl_local._4_4_;
}

Assistant:

int ssl_send_alert_impl(SSL *ssl, int level, int desc) {
  // It is illegal to send an alert when we've already sent a closing one.
  if (ssl->s3->write_shutdown != ssl_shutdown_none) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_PROTOCOL_IS_SHUTDOWN);
    return -1;
  }

  if (level == SSL3_AL_WARNING && desc == SSL_AD_CLOSE_NOTIFY) {
    ssl->s3->write_shutdown = ssl_shutdown_close_notify;
  } else {
    assert(level == SSL3_AL_FATAL);
    assert(desc != SSL_AD_CLOSE_NOTIFY);
    ssl->s3->write_shutdown = ssl_shutdown_error;
  }

  ssl->s3->alert_dispatch = true;
  ssl->s3->send_alert[0] = level;
  ssl->s3->send_alert[1] = desc;
  if (ssl->s3->write_buffer.empty()) {
    // Nothing is being written out, so the alert may be dispatched
    // immediately.
    return ssl->method->dispatch_alert(ssl);
  }

  // The alert will be dispatched later.
  return -1;
}